

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int QAnyStringView::compare(QAnyStringView lhs,QAnyStringView rhs,CaseSensitivity cs)

{
  int iVar1;
  long in_FS_OFFSET;
  anon_class_24_2_c96e93d3 *in_stack_fffffffffffffff0;
  QAnyStringView *this;
  
  this = *(QAnyStringView **)(in_FS_OFFSET + 0x28);
  iVar1 = visit<QAnyStringView::compare(QAnyStringView,QAnyStringView,Qt::CaseSensitivity)::__0>
                    (this,in_stack_fffffffffffffff0);
  if (*(QAnyStringView **)(in_FS_OFFSET + 0x28) == this) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QAnyStringView::compare(QAnyStringView lhs, QAnyStringView rhs, Qt::CaseSensitivity cs) noexcept
{
    return lhs.visit([rhs, cs](auto lhs) {
        return rhs.visit([lhs, cs](auto rhs) {
            return QtPrivate::compareStrings(lhs, rhs, cs);
        });
    });
}